

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
__thiscall cmGeneratorExpression::Parse(cmGeneratorExpression *this,string *input)

{
  cmCompiledGeneratorExpression *this_00;
  string *in_RDX;
  string local_50;
  cmListFileBacktrace local_30;
  string *local_20;
  string *input_local;
  cmGeneratorExpression *this_local;
  
  local_20 = in_RDX;
  input_local = input;
  this_local = this;
  this_00 = (cmCompiledGeneratorExpression *)operator_new(0x170);
  cmListFileBacktrace::cmListFileBacktrace(&local_30,(cmListFileBacktrace *)input);
  std::__cxx11::string::string((string *)&local_50,local_20);
  cmCompiledGeneratorExpression::cmCompiledGeneratorExpression(this_00,&local_30,&local_50);
  std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>
  ::unique_ptr<std::default_delete<cmCompiledGeneratorExpression>,void>
            ((unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>
              *)this,this_00);
  std::__cxx11::string::~string((string *)&local_50);
  cmListFileBacktrace::~cmListFileBacktrace(&local_30);
  return (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  std::string const& input)
{
  return std::unique_ptr<cmCompiledGeneratorExpression>(
    new cmCompiledGeneratorExpression(this->Backtrace, input));
}